

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O0

Aig_Obj_t * Aig_ObjRecognizeMux(Aig_Obj_t *pNode,Aig_Obj_t **ppNodeT,Aig_Obj_t **ppNodeE)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pNode1;
  Aig_Obj_t *pNode0;
  Aig_Obj_t **ppNodeE_local;
  Aig_Obj_t **ppNodeT_local;
  Aig_Obj_t *pNode_local;
  
  iVar1 = Aig_IsComplement(pNode);
  if (iVar1 != 0) {
    __assert_fail("!Aig_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigUtil.c"
                  ,0x186,"Aig_Obj_t *Aig_ObjRecognizeMux(Aig_Obj_t *, Aig_Obj_t **, Aig_Obj_t **)");
  }
  iVar1 = Aig_ObjIsMuxType(pNode);
  if (iVar1 != 0) {
    pAVar3 = Aig_ObjFanin0(pNode);
    pAVar4 = Aig_ObjFanin1(pNode);
    pAVar5 = Aig_ObjFanin1(pAVar3);
    pAVar6 = Aig_ObjFanin1(pAVar4);
    if (pAVar5 == pAVar6) {
      iVar1 = Aig_ObjFaninC1(pAVar3);
      iVar2 = Aig_ObjFaninC1(pAVar4);
      if (iVar1 != iVar2) {
        iVar1 = Aig_ObjFaninC1(pAVar3);
        if (iVar1 != 0) {
          pAVar5 = Aig_ObjChild0(pAVar4);
          pAVar5 = Aig_Not(pAVar5);
          *ppNodeT = pAVar5;
          pAVar3 = Aig_ObjChild0(pAVar3);
          pAVar3 = Aig_Not(pAVar3);
          *ppNodeE = pAVar3;
          pAVar3 = Aig_ObjChild1(pAVar4);
          return pAVar3;
        }
        pAVar5 = Aig_ObjChild0(pAVar3);
        pAVar5 = Aig_Not(pAVar5);
        *ppNodeT = pAVar5;
        pAVar4 = Aig_ObjChild0(pAVar4);
        pAVar4 = Aig_Not(pAVar4);
        *ppNodeE = pAVar4;
        pAVar3 = Aig_ObjChild1(pAVar3);
        return pAVar3;
      }
    }
    pAVar5 = Aig_ObjFanin0(pAVar3);
    pAVar6 = Aig_ObjFanin0(pAVar4);
    if (pAVar5 == pAVar6) {
      iVar1 = Aig_ObjFaninC0(pAVar3);
      iVar2 = Aig_ObjFaninC0(pAVar4);
      if (iVar1 != iVar2) {
        iVar1 = Aig_ObjFaninC0(pAVar3);
        if (iVar1 != 0) {
          pAVar5 = Aig_ObjChild1(pAVar4);
          pAVar5 = Aig_Not(pAVar5);
          *ppNodeT = pAVar5;
          pAVar3 = Aig_ObjChild1(pAVar3);
          pAVar3 = Aig_Not(pAVar3);
          *ppNodeE = pAVar3;
          pAVar3 = Aig_ObjChild0(pAVar4);
          return pAVar3;
        }
        pAVar5 = Aig_ObjChild1(pAVar3);
        pAVar5 = Aig_Not(pAVar5);
        *ppNodeT = pAVar5;
        pAVar4 = Aig_ObjChild1(pAVar4);
        pAVar4 = Aig_Not(pAVar4);
        *ppNodeE = pAVar4;
        pAVar3 = Aig_ObjChild0(pAVar3);
        return pAVar3;
      }
    }
    pAVar5 = Aig_ObjFanin0(pAVar3);
    pAVar6 = Aig_ObjFanin1(pAVar4);
    if (pAVar5 == pAVar6) {
      iVar1 = Aig_ObjFaninC0(pAVar3);
      iVar2 = Aig_ObjFaninC1(pAVar4);
      if (iVar1 != iVar2) {
        iVar1 = Aig_ObjFaninC0(pAVar3);
        if (iVar1 != 0) {
          pAVar5 = Aig_ObjChild0(pAVar4);
          pAVar5 = Aig_Not(pAVar5);
          *ppNodeT = pAVar5;
          pAVar3 = Aig_ObjChild1(pAVar3);
          pAVar3 = Aig_Not(pAVar3);
          *ppNodeE = pAVar3;
          pAVar3 = Aig_ObjChild1(pAVar4);
          return pAVar3;
        }
        pAVar5 = Aig_ObjChild1(pAVar3);
        pAVar5 = Aig_Not(pAVar5);
        *ppNodeT = pAVar5;
        pAVar4 = Aig_ObjChild0(pAVar4);
        pAVar4 = Aig_Not(pAVar4);
        *ppNodeE = pAVar4;
        pAVar3 = Aig_ObjChild0(pAVar3);
        return pAVar3;
      }
    }
    pAVar5 = Aig_ObjFanin1(pAVar3);
    pAVar6 = Aig_ObjFanin0(pAVar4);
    if (pAVar5 == pAVar6) {
      iVar1 = Aig_ObjFaninC1(pAVar3);
      iVar2 = Aig_ObjFaninC0(pAVar4);
      if (iVar1 != iVar2) {
        iVar1 = Aig_ObjFaninC1(pAVar3);
        if (iVar1 == 0) {
          pAVar5 = Aig_ObjChild0(pAVar3);
          pAVar5 = Aig_Not(pAVar5);
          *ppNodeT = pAVar5;
          pAVar4 = Aig_ObjChild1(pAVar4);
          pAVar4 = Aig_Not(pAVar4);
          *ppNodeE = pAVar4;
          pNode_local = Aig_ObjChild1(pAVar3);
        }
        else {
          pAVar5 = Aig_ObjChild1(pAVar4);
          pAVar5 = Aig_Not(pAVar5);
          *ppNodeT = pAVar5;
          pAVar3 = Aig_ObjChild0(pAVar3);
          pAVar3 = Aig_Not(pAVar3);
          *ppNodeE = pAVar3;
          pNode_local = Aig_ObjChild0(pAVar4);
        }
        return pNode_local;
      }
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigUtil.c"
                  ,0x1cd,"Aig_Obj_t *Aig_ObjRecognizeMux(Aig_Obj_t *, Aig_Obj_t **, Aig_Obj_t **)");
  }
  __assert_fail("Aig_ObjIsMuxType(pNode)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aigUtil.c"
                ,0x187,"Aig_Obj_t *Aig_ObjRecognizeMux(Aig_Obj_t *, Aig_Obj_t **, Aig_Obj_t **)");
}

Assistant:

Aig_Obj_t * Aig_ObjRecognizeMux( Aig_Obj_t * pNode, Aig_Obj_t ** ppNodeT, Aig_Obj_t ** ppNodeE )
{
    Aig_Obj_t * pNode0, * pNode1;
    assert( !Aig_IsComplement(pNode) );
    assert( Aig_ObjIsMuxType(pNode) );
    // get children
    pNode0 = Aig_ObjFanin0(pNode);
    pNode1 = Aig_ObjFanin1(pNode);

    // find the control variable
    if ( Aig_ObjFanin1(pNode0) == Aig_ObjFanin1(pNode1) && (Aig_ObjFaninC1(pNode0) ^ Aig_ObjFaninC1(pNode1)) )
    {
//        if ( Fraig_IsComplement(pNode1->p2) )
        if ( Aig_ObjFaninC1(pNode0) )
        { // pNode2->p2 is positive phase of C
            *ppNodeT = Aig_Not(Aig_ObjChild0(pNode1));//pNode2->p1);
            *ppNodeE = Aig_Not(Aig_ObjChild0(pNode0));//pNode1->p1);
            return Aig_ObjChild1(pNode1);//pNode2->p2;
        }
        else
        { // pNode1->p2 is positive phase of C
            *ppNodeT = Aig_Not(Aig_ObjChild0(pNode0));//pNode1->p1);
            *ppNodeE = Aig_Not(Aig_ObjChild0(pNode1));//pNode2->p1);
            return Aig_ObjChild1(pNode0);//pNode1->p2;
        }
    }
    else if ( Aig_ObjFanin0(pNode0) == Aig_ObjFanin0(pNode1) && (Aig_ObjFaninC0(pNode0) ^ Aig_ObjFaninC0(pNode1)) )
    {
//        if ( Fraig_IsComplement(pNode1->p1) )
        if ( Aig_ObjFaninC0(pNode0) )
        { // pNode2->p1 is positive phase of C
            *ppNodeT = Aig_Not(Aig_ObjChild1(pNode1));//pNode2->p2);
            *ppNodeE = Aig_Not(Aig_ObjChild1(pNode0));//pNode1->p2);
            return Aig_ObjChild0(pNode1);//pNode2->p1;
        }
        else
        { // pNode1->p1 is positive phase of C
            *ppNodeT = Aig_Not(Aig_ObjChild1(pNode0));//pNode1->p2);
            *ppNodeE = Aig_Not(Aig_ObjChild1(pNode1));//pNode2->p2);
            return Aig_ObjChild0(pNode0);//pNode1->p1;
        }
    }
    else if ( Aig_ObjFanin0(pNode0) == Aig_ObjFanin1(pNode1) && (Aig_ObjFaninC0(pNode0) ^ Aig_ObjFaninC1(pNode1)) )
    {
//        if ( Fraig_IsComplement(pNode1->p1) )
        if ( Aig_ObjFaninC0(pNode0) )
        { // pNode2->p2 is positive phase of C
            *ppNodeT = Aig_Not(Aig_ObjChild0(pNode1));//pNode2->p1);
            *ppNodeE = Aig_Not(Aig_ObjChild1(pNode0));//pNode1->p2);
            return Aig_ObjChild1(pNode1);//pNode2->p2;
        }
        else
        { // pNode1->p1 is positive phase of C
            *ppNodeT = Aig_Not(Aig_ObjChild1(pNode0));//pNode1->p2);
            *ppNodeE = Aig_Not(Aig_ObjChild0(pNode1));//pNode2->p1);
            return Aig_ObjChild0(pNode0);//pNode1->p1;
        }
    }
    else if ( Aig_ObjFanin1(pNode0) == Aig_ObjFanin0(pNode1) && (Aig_ObjFaninC1(pNode0) ^ Aig_ObjFaninC0(pNode1)) )
    {
//        if ( Fraig_IsComplement(pNode1->p2) )
        if ( Aig_ObjFaninC1(pNode0) )
        { // pNode2->p1 is positive phase of C
            *ppNodeT = Aig_Not(Aig_ObjChild1(pNode1));//pNode2->p2);
            *ppNodeE = Aig_Not(Aig_ObjChild0(pNode0));//pNode1->p1);
            return Aig_ObjChild0(pNode1);//pNode2->p1;
        }
        else
        { // pNode1->p2 is positive phase of C
            *ppNodeT = Aig_Not(Aig_ObjChild0(pNode0));//pNode1->p1);
            *ppNodeE = Aig_Not(Aig_ObjChild1(pNode1));//pNode2->p2);
            return Aig_ObjChild1(pNode0);//pNode1->p2;
        }
    }
    assert( 0 ); // this is not MUX
    return NULL;
}